

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall qclab::qgates::QRotationGate1<double>::QRotationGate1(QRotationGate1<double> *this)

{
  QRotationGate1<double> *this_local;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,0);
  QAdjustable::QAdjustable((QAdjustable *)&(this->super_QGate1<double>).field_0xc,false);
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_001538b8;
  QRotation<double>::QRotation(&this->rotation_);
  return;
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }